

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O1

double AccumulateSSIM(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  uVar4 = 3;
  if (w < 3) {
    uVar4 = w;
  }
  uVar7 = 3;
  if (h < 3) {
    uVar7 = h;
  }
  if (h < 1) {
    uVar5 = 0;
    dVar9 = 0.0;
  }
  else {
    dVar9 = 0.0;
    uVar5 = 0;
    do {
      if (0 < w) {
        iVar6 = 0;
        do {
          dVar10 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,iVar6,(int)uVar5,w,h);
          dVar9 = dVar9 + dVar10;
          iVar6 = iVar6 + 1;
        } while (w != iVar6);
      }
      uVar3 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar3;
    } while (uVar3 != uVar7);
  }
  if ((int)uVar5 < (int)(h - 4U)) {
    puVar2 = ref + (uVar5 - 3) * (long)ref_stride + -3;
    puVar1 = src + (uVar5 - 3) * (long)src_stride + -3;
    do {
      if (w < 1) {
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        do {
          dVar10 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,(int)uVar8,(int)uVar5,w,h);
          dVar9 = dVar9 + dVar10;
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while (uVar4 != uVar7);
      }
      if ((int)uVar8 < (int)(w - 4U)) {
        do {
          dVar10 = (*VP8SSIMGet)(puVar1 + uVar8,src_stride,puVar2 + uVar8,ref_stride);
          dVar9 = dVar9 + dVar10;
          uVar8 = uVar8 + 1;
        } while (w - 4U != uVar8);
      }
      if ((int)uVar8 < w) {
        do {
          dVar10 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,(int)uVar8,(int)uVar5,w,h);
          dVar9 = dVar9 + dVar10;
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while (w != uVar7);
      }
      uVar5 = uVar5 + 1;
      puVar2 = puVar2 + ref_stride;
      puVar1 = puVar1 + src_stride;
    } while (uVar5 != h - 4U);
  }
  if ((int)uVar5 < h) {
    do {
      if (0 < w) {
        iVar6 = 0;
        do {
          dVar10 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,iVar6,(int)uVar5,w,h);
          dVar9 = dVar9 + dVar10;
          iVar6 = iVar6 + 1;
        } while (w != iVar6);
      }
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 != h);
  }
  return dVar9;
}

Assistant:

static double AccumulateSSIM(const uint8_t* src, int src_stride,
                             const uint8_t* ref, int ref_stride,
                             int w, int h) {
  const int w0 = (w < VP8_SSIM_KERNEL) ? w : VP8_SSIM_KERNEL;
  const int w1 = w - VP8_SSIM_KERNEL - 1;
  const int h0 = (h < VP8_SSIM_KERNEL) ? h : VP8_SSIM_KERNEL;
  const int h1 = h - VP8_SSIM_KERNEL - 1;
  int x, y;
  double sum = 0.;
  for (y = 0; y < h0; ++y) {
    for (x = 0; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  for (; y < h1; ++y) {
    for (x = 0; x < w0; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
    for (; x < w1; ++x) {
      const int off1 = x - VP8_SSIM_KERNEL + (y - VP8_SSIM_KERNEL) * src_stride;
      const int off2 = x - VP8_SSIM_KERNEL + (y - VP8_SSIM_KERNEL) * ref_stride;
      sum += VP8SSIMGet(src + off1, src_stride, ref + off2, ref_stride);
    }
    for (; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  for (; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  return sum;
}